

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

void Abc_NtkReassignIds(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *p_00;
  int local_40;
  int local_3c;
  int k;
  int i;
  Abc_Obj_t *pConst1;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vObjsNew;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x716,"void Abc_NtkReassignIds(Abc_Ntk_t *)");
  }
  p = Vec_PtrAlloc(pNtk->nObjs);
  pAVar2 = Abc_AigConst1(pNtk);
  if (pAVar2->Id == 0) {
    Vec_PtrPush(p,pAVar2);
    for (local_3c = 0; iVar1 = Abc_NtkPiNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar3 = Abc_NtkPi(pNtk,local_3c);
      iVar1 = Vec_PtrSize(p);
      pAVar3->Id = iVar1;
      Vec_PtrPush(p,pAVar3);
    }
    for (local_3c = 0; iVar1 = Abc_NtkPoNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar3 = Abc_NtkPo(pNtk,local_3c);
      iVar1 = Vec_PtrSize(p);
      pAVar3->Id = iVar1;
      Vec_PtrPush(p,pAVar3);
    }
    for (local_3c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_3c < iVar1; local_3c = local_3c + 1)
    {
      pAVar3 = Abc_NtkBox(pNtk,local_3c);
      iVar1 = Vec_PtrSize(p);
      pAVar3->Id = iVar1;
      Vec_PtrPush(p,pAVar3);
      for (local_40 = 0; iVar1 = Abc_ObjFaninNum(pAVar3), local_40 < iVar1; local_40 = local_40 + 1)
      {
        pAVar4 = Abc_ObjFanin(pAVar3,local_40);
        iVar1 = Vec_PtrSize(p);
        pAVar4->Id = iVar1;
        Vec_PtrPush(p,pAVar4);
      }
      for (local_40 = 0; iVar1 = Abc_ObjFanoutNum(pAVar3), local_40 < iVar1; local_40 = local_40 + 1
          ) {
        pAVar4 = Abc_ObjFanout(pAVar3,local_40);
        iVar1 = Vec_PtrSize(p);
        pAVar4->Id = iVar1;
        Vec_PtrPush(p,pAVar4);
      }
    }
    p_00 = Abc_AigDfs(pNtk,1,0);
    for (local_3c = 0; iVar1 = Vec_PtrSize(p_00), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p_00,local_3c);
      if (pAVar3 != pAVar2) {
        iVar1 = Vec_PtrSize(p);
        pAVar3->Id = iVar1;
        Vec_PtrPush(p,pAVar3);
      }
    }
    Vec_PtrFree(p_00);
    iVar1 = Vec_PtrSize(p);
    if (iVar1 == pNtk->nObjs) {
      for (local_3c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_3c < iVar1; local_3c = local_3c + 1
          ) {
        pAVar2 = Abc_NtkObj(pNtk,local_3c);
        if (pAVar2 != (Abc_Obj_t *)0x0) {
          for (local_40 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_40 < iVar1;
              local_40 = local_40 + 1) {
            pAVar3 = Abc_ObjFanin(pAVar2,local_40);
            (pAVar2->vFanins).pArray[local_40] = pAVar3->Id;
          }
          for (local_40 = 0; iVar1 = Abc_ObjFanoutNum(pAVar2), local_40 < iVar1;
              local_40 = local_40 + 1) {
            pAVar3 = Abc_ObjFanout(pAVar2,local_40);
            (pAVar2->vFanouts).pArray[local_40] = pAVar3->Id;
          }
        }
      }
      Vec_PtrFree(pNtk->vObjs);
      pNtk->vObjs = p;
      Abc_AigRehash((Abc_Aig_t *)pNtk->pManFunc);
      return;
    }
    __assert_fail("Vec_PtrSize(vObjsNew) == pNtk->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x744,"void Abc_NtkReassignIds(Abc_Ntk_t *)");
  }
  __assert_fail("pConst1->Id == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                ,0x71c,"void Abc_NtkReassignIds(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkReassignIds( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Vec_Ptr_t * vObjsNew;
    Abc_Obj_t * pNode, * pTemp, * pConst1;
    int i, k;
    assert( Abc_NtkIsStrash(pNtk) );
//printf( "Total = %d. Current = %d.\n", Abc_NtkObjNumMax(pNtk), Abc_NtkObjNum(pNtk) );
    // start the array of objects with new IDs
    vObjsNew = Vec_PtrAlloc( pNtk->nObjs );
    // put constant node first
    pConst1 = Abc_AigConst1(pNtk);
    assert( pConst1->Id == 0 );
    Vec_PtrPush( vObjsNew, pConst1 );
    // put PI nodes next
    Abc_NtkForEachPi( pNtk, pNode, i )
    {
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
    }
    // put PO nodes next
    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
    }
    // put latches and their inputs/outputs next
    Abc_NtkForEachBox( pNtk, pNode, i )
    {
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
        Abc_ObjForEachFanin( pNode, pTemp, k )
        {
            pTemp->Id = Vec_PtrSize( vObjsNew );
            Vec_PtrPush( vObjsNew, pTemp );
        }
        Abc_ObjForEachFanout( pNode, pTemp, k )
        {
            pTemp->Id = Vec_PtrSize( vObjsNew );
            Vec_PtrPush( vObjsNew, pTemp );
        }
    }
    // finally, internal nodes in the DFS order
    vNodes = Abc_AigDfs( pNtk, 1, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( pNode == pConst1 )
            continue;
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
    }
    Vec_PtrFree( vNodes );
    assert( Vec_PtrSize(vObjsNew) == pNtk->nObjs );

    // update the fanin/fanout arrays
    Abc_NtkForEachObj( pNtk, pNode, i )
    {
        Abc_ObjForEachFanin( pNode, pTemp, k )
            pNode->vFanins.pArray[k] = pTemp->Id;
        Abc_ObjForEachFanout( pNode, pTemp, k )
            pNode->vFanouts.pArray[k] = pTemp->Id;
    }

    // replace the array of objs
    Vec_PtrFree( pNtk->vObjs );
    pNtk->vObjs = vObjsNew;

    // rehash the AIG
    Abc_AigRehash( (Abc_Aig_t *)pNtk->pManFunc );

    // update the name manager!!!
}